

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall
QTableViewPrivate::trimHiddenSelections(QTableViewPrivate *this,QItemSelectionRange *range)

{
  QAbstractItemModel *pQVar1;
  int logicalIndex;
  QPersistentModelIndexData *pQVar2;
  QPersistentModelIndexData *pQVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int logicalIndex_00;
  QModelIndex *this_00;
  long in_FS_OFFSET;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  QModelIndex local_98;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QPersistentModelIndexData *local_58;
  QPersistentModelIndexData *pQStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = QPersistentModelIndex::row();
  iVar6 = QPersistentModelIndex::column();
  iVar7 = QPersistentModelIndex::row();
  logicalIndex_00 = QPersistentModelIndex::column();
  while ((iVar5 <= iVar7 &&
         (bVar4 = QHeaderView::isSectionHidden(this->verticalHeader,iVar7), bVar4))) {
    iVar7 = iVar7 + -1;
  }
  for (; iVar6 <= logicalIndex_00; logicalIndex_00 = logicalIndex_00 + -1) {
    bVar4 = QHeaderView::isSectionHidden(this->horizontalHeader,logicalIndex_00);
    if (!bVar4) {
      if (iVar5 <= iVar7) goto LAB_005282db;
      break;
    }
  }
  this_00 = (QModelIndex *)&local_58;
  local_58 = (QPersistentModelIndexData *)0x0;
  pQStack_50 = (QPersistentModelIndexData *)0x0;
  QItemSelectionRange::QItemSelectionRange((QItemSelectionRange *)this_00);
  pQVar2 = (range->tl).d;
  pQVar3 = (range->br).d;
  (range->tl).d = local_58;
  (range->br).d = pQStack_50;
  local_58 = pQVar2;
  pQStack_50 = pQVar3;
  goto LAB_00528415;
  while (iVar5 = logicalIndex + 1, bVar4) {
LAB_005282db:
    logicalIndex = iVar5;
    bVar4 = QHeaderView::isSectionHidden(this->verticalHeader,logicalIndex);
    if (iVar7 < logicalIndex) break;
  }
  do {
    iVar5 = iVar6;
    bVar4 = QHeaderView::isSectionHidden(this->horizontalHeader,iVar5);
    if (logicalIndex_00 < iVar5) break;
    iVar6 = iVar5 + 1;
  } while (bVar4);
  if (iVar7 < logicalIndex || logicalIndex_00 < iVar5) {
    this_00 = (QModelIndex *)&local_58;
    local_58 = (QPersistentModelIndexData *)0x0;
    pQStack_50 = (QPersistentModelIndexData *)0x0;
    QItemSelectionRange::QItemSelectionRange((QItemSelectionRange *)this_00);
    uVar8 = *(undefined4 *)&(range->tl).d;
    iVar7 = *(int *)((long)&(range->tl).d + 4);
    uVar9 = *(undefined4 *)&(range->br).d;
    uVar10 = *(undefined4 *)((long)&(range->br).d + 4);
    (range->tl).d = local_58;
    (range->br).d = pQStack_50;
  }
  else {
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::parent();
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_58,pQVar1,iVar7,logicalIndex_00,&local_78);
    local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::parent();
    (**(code **)(*(long *)pQVar1 + 0x60))
              ((QModelIndex *)&local_78,pQVar1,logicalIndex,iVar5,&local_98);
    this_00 = &local_98;
    QItemSelectionRange::QItemSelectionRange
              ((QItemSelectionRange *)this_00,(QModelIndex *)&local_78,(QModelIndex *)&local_58);
    uVar8 = *(undefined4 *)&(range->tl).d;
    iVar7 = *(int *)((long)&(range->tl).d + 4);
    uVar9 = *(undefined4 *)&(range->br).d;
    uVar10 = *(undefined4 *)((long)&(range->br).d + 4);
    (range->tl).d = (QPersistentModelIndexData *)local_98._0_8_;
    (range->br).d = (QPersistentModelIndexData *)local_98.i;
  }
  *(undefined4 *)&((QPersistentModelIndex *)&this_00->r)->d = uVar8;
  this_00->c = iVar7;
  *(undefined4 *)&((QPersistentModelIndex *)&this_00->i)->d = uVar9;
  *(undefined4 *)((long)&((QPersistentModelIndex *)&this_00->i)->d + 4) = uVar10;
LAB_00528415:
  QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableViewPrivate::trimHiddenSelections(QItemSelectionRange *range) const
{
    Q_ASSERT(range && range->isValid());

    int top = range->top();
    int left = range->left();
    int bottom = range->bottom();
    int right = range->right();

    while (bottom >= top && verticalHeader->isSectionHidden(bottom))
        --bottom;
    while (right >= left && horizontalHeader->isSectionHidden(right))
        --right;

    if (top > bottom || left > right) { // everything is hidden
        *range = QItemSelectionRange();
        return;
    }

    while (verticalHeader->isSectionHidden(top) && top <= bottom)
        ++top;
    while (horizontalHeader->isSectionHidden(left) && left <= right)
        ++left;

    if (top > bottom || left > right) { // everything is hidden
        *range = QItemSelectionRange();
        return;
    }

    QModelIndex bottomRight = model->index(bottom, right, range->parent());
    QModelIndex topLeft = model->index(top, left, range->parent());
    *range = QItemSelectionRange(topLeft, bottomRight);
}